

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinMan.c
# Opt level: O1

void Min_ManClean(Min_Man_t *p,int nSupp)

{
  p->nVars = nSupp;
  p->nWords = ((nSupp >> 4) + 1) - (uint)((nSupp & 0xfU) == 0);
  memset(p->ppStore,0,(long)nSupp * 8 + 8);
  p->nCubes = 0;
  return;
}

Assistant:

void Min_ManClean( Min_Man_t * p, int nSupp )
{
    // set the size of the cube manager
    p->nVars  = nSupp;
    p->nWords = Abc_BitWordNum(2*nSupp);
    // clean the storage
    memset( p->ppStore, 0, sizeof(Min_Cube_t *) * (nSupp + 1) );
    p->nCubes = 0;
}